

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O0

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeCol(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,int n,
           LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *newCol,bool scale)

{
  char *pcVar1;
  int *piVar2;
  byte in_CL;
  LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar3;
  undefined8 extraout_RDX_03;
  uint in_ESI;
  LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  int idx;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *newcol;
  int position;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *row;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *col;
  int j;
  undefined4 in_stack_fffffffffffffc58;
  int in_stack_fffffffffffffc5c;
  int in_stack_fffffffffffffc60;
  int in_stack_fffffffffffffc64;
  uint uVar4;
  undefined4 in_stack_fffffffffffffc68;
  uint n_00;
  undefined4 in_stack_fffffffffffffc6c;
  uint i;
  undefined1 local_384 [112];
  int in_stack_fffffffffffffcec;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffcf0;
  undefined1 local_304 [128];
  undefined1 local_284 [128];
  int local_204;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_200;
  undefined1 local_1f4 [128];
  undefined1 local_174 [128];
  undefined1 local_f4 [128];
  uint local_74;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_70;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_68;
  uint local_60;
  byte local_59;
  LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_58;
  uint local_4c;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_59 = in_CL & 1;
  if (-1 < (int)in_ESI) {
    local_58 = in_RDX;
    local_4c = in_ESI;
    local_68 = colVector_w((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                           in_stack_fffffffffffffc5c);
    local_60 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::size(local_68);
    uVar3 = extraout_RDX;
    while (local_60 = local_60 - 1, -1 < (int)local_60) {
      SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::index(local_68,(char *)(ulong)local_60,(int)uVar3);
      local_70 = rowVector_w((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                             in_stack_fffffffffffffc5c);
      local_74 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::pos((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                       in_stack_fffffffffffffc64);
      uVar3 = extraout_RDX_00;
      if (-1 < (int)local_74) {
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::remove(local_70,(char *)(ulong)local_74);
        uVar3 = extraout_RDX_01;
      }
    }
    SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::clear((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x68a292);
    uVar4 = local_4c;
    LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::upper((LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
    (*(in_RDI->
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x2d])(in_RDI,(ulong)uVar4,local_f4,(ulong)(local_59 & 1));
    n_00 = local_4c;
    LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::lower((LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
    (*(in_RDI->
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x2a])(in_RDI,(ulong)n_00,local_174,(ulong)(local_59 & 1));
    i = local_4c;
    LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::obj((LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
    (*(in_RDI->
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x24])(in_RDI,(ulong)i,local_1f4,(ulong)(local_59 & 1));
    local_200 = LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::colVector(local_58);
    local_60 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::size(local_200);
    uVar3 = extraout_RDX_02;
    while (local_60 = local_60 - 1, -1 < (int)local_60) {
      pcVar1 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::index(local_200,(char *)(ulong)local_60,(int)uVar3);
      local_204 = (int)pcVar1;
      local_40 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::value(local_200,local_60);
      local_38 = local_284;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<200U,_int,_void> *)CONCAT44(uVar4,in_stack_fffffffffffffc60),
                 (cpp_dec_float<200U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      if ((local_59 & 1) != 0) {
        local_28 = local_384;
        local_30 = local_284;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<200U,_int,_void> *)CONCAT44(uVar4,in_stack_fffffffffffffc60),
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
        piVar2 = DataArray<int>::operator[](&in_RDI[1].scaleExp,local_4c);
        in_stack_fffffffffffffc60 = *piVar2;
        DataArray<int>::operator[](&in_RDI->scaleExp,local_204);
        spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                  (in_stack_fffffffffffffcf0,in_stack_fffffffffffffcec);
        local_18 = local_284;
        local_20 = local_304;
        local_10 = local_20;
        local_8 = local_20;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  ((cpp_dec_float<200U,_int,_void> *)CONCAT44(uVar4,in_stack_fffffffffffffc60),
                   (cpp_dec_float<200U,_int,_void> *)
                   CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      }
      LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::add2((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)in_RDI,i,n_00,(int *)CONCAT44(uVar4,in_stack_fffffffffffffc60),
             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::add2(in_RDI,i,n_00,(int *)CONCAT44(uVar4,in_stack_fffffffffffffc60),
             (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      uVar3 = extraout_RDX_03;
    }
  }
  return;
}

Assistant:

virtual void changeCol(int n, const LPColBase<R>& newCol, bool scale = false)
   {
      if(n < 0)
         return;

      int j;
      SVectorBase<R>& col = colVector_w(n);

      for(j = col.size() - 1; j >= 0; --j)
      {
         SVectorBase<R>& row = rowVector_w(col.index(j));
         int position = row.pos(n);

         assert(position != -1);

         if(position >= 0)
            row.remove(position);
      }

      col.clear();

      changeUpper(n, newCol.upper(), scale);
      changeLower(n, newCol.lower(), scale);
      changeObj(n, newCol.obj(), scale);

      const SVectorBase<R>& newcol = newCol.colVector();

      for(j = newcol.size() - 1; j >= 0; --j)
      {
         int idx = newcol.index(j);
         R val = newcol.value(j);

         if(scale)
            val = spxLdexp(val, LPColSetBase<R>::scaleExp[n] + LPRowSetBase<R>::scaleExp[idx]);

         LPColSetBase<R>::add2(n, 1, &idx, &val);
         LPRowSetBase<R>::add2(idx, 1, &n, &val);
      }

      assert(isConsistent());
   }